

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void CheckRangeCallback(void *ptr,Type type,size_t min_size)

{
  bool bVar1;
  long *plVar2;
  char *message;
  char *in_R9;
  string local_b0;
  AssertHelper local_90 [3];
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  FunctionRefFirstDataArg<void_(const_base::MallocRange_*)> ref;
  anon_class_32_4_7539d260 callback;
  uintptr_t addr;
  size_t sStack_20;
  bool matched;
  size_t min_size_local;
  void *pvStack_10;
  Type type_local;
  void *ptr_local;
  
  addr._7_1_ = 0;
  ref.data = &callback.matched;
  callback.addr = (uintptr_t *)((long)&min_size_local + 4);
  callback.type = (Type *)&stack0xffffffffffffffe0;
  callback.min_size = (size_t *)((long)&addr + 7);
  callback.matched = (bool *)ptr;
  sStack_20 = min_size;
  min_size_local._4_4_ = type;
  pvStack_10 = ptr;
  tcmalloc::FunctionRefFirstDataArg<void(base::MallocRange_const*)>::
  FunctionRefFirstDataArg<CheckRangeCallback(void*,base::MallocRange::Type,unsigned_long)::__0>
            ((FunctionRefFirstDataArg<void(base::MallocRange_const*)> *)&gtest_ar_.message_,
             (anon_class_32_4_7539d260 *)&ref.data);
  plVar2 = (long *)MallocExtension::instance();
  (**(code **)(*plVar2 + 0x50))
            (plVar2,ref.fn,
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_70,(bool *)((long)&addr + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)local_70,(AssertionResult *)"matched","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x3b5,message);
    testing::internal::AssertHelper::operator=(local_90,&local_78);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

static void CheckRangeCallback(void* ptr, base::MallocRange::Type type,
                               size_t min_size) {
  bool matched = false;
  const uintptr_t addr = reinterpret_cast<uintptr_t>(ptr);
  auto callback = [&] (const base::MallocRange* r) -> void {
    if (!(r->address <= addr && addr < r->address + r->length)) {
      return;
    }

    if (type == base::MallocRange::FREE) {
      // We are expecting r->type == FREE, but ReleaseMemory
      // may have already moved us to UNMAPPED state instead (this happens in
      // approximately 0.1% of executions). Accept either state.
      CHECK(r->type == base::MallocRange::FREE ||
            r->type == base::MallocRange::UNMAPPED);
    } else {
      CHECK_EQ(r->type, type);
    }
    CHECK_GE(r->length, min_size);

    matched = true;
  };

  tcmalloc::FunctionRefFirstDataArg<void(const base::MallocRange*)> ref(callback);
  MallocExtension::instance()->Ranges(ref.data, ref.fn);
  EXPECT_TRUE(matched);
}